

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

uint64_t ar_atol8(char *p,uint char_cnt)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  uint base;
  uint digit;
  uint64_t last_digit_limit;
  uint64_t limit;
  uint64_t l;
  uint char_cnt_local;
  char *p_local;
  
  uVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT416(8),0);
  char_cnt_local = char_cnt;
  p_local = p;
  while( true ) {
    if ((*p_local == ' ') || (bVar3 = false, *p_local == '\t')) {
      bVar3 = char_cnt_local != 0;
      char_cnt_local = char_cnt_local - 1;
    }
    if (!bVar3) break;
    p_local = p_local + 1;
  }
  l = 0;
  cVar1 = *p_local;
  while( true ) {
    digit = (int)cVar1 - 0x30;
    bVar3 = false;
    if (('/' < *p_local) && (bVar3 = false, digit < 8)) {
      bVar3 = char_cnt_local != 0;
      char_cnt_local = char_cnt_local - 1;
    }
    if (!bVar3) break;
    if ((uVar2 < l) ||
       ((l == uVar2 &&
        (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % ZEXT416(8),0) < (ulong)digit)))
       ) {
      return 0xffffffffffffffff;
    }
    l = l * 8 + (ulong)digit;
    cVar1 = p_local[1];
    p_local = p_local + 1;
  }
  return l;
}

Assistant:

static uint64_t
ar_atol8(const char *p, unsigned char_cnt)
{
	uint64_t l, limit, last_digit_limit;
	unsigned int digit, base;

	base = 8;
	limit = UINT64_MAX / base;
	last_digit_limit = UINT64_MAX % base;

	while ((*p == ' ' || *p == '\t') && char_cnt-- > 0)
		p++;

	l = 0;
	digit = *p - '0';
	while (*p >= '0' && digit < base  && char_cnt-- > 0) {
		if (l>limit || (l == limit && digit > last_digit_limit)) {
			l = UINT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++p - '0';
	}
	return (l);
}